

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void pulse_prog_horde_jackal(OBJ_DATA *obj,bool isTick)

{
  CHAR_DATA *ch;
  CHAR_DATA *pCVar1;
  bool bVar2;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  ch = obj->carried_by;
  if (ch != (CHAR_DATA *)0x0) {
    pCVar1 = ch->fighting;
    bVar2 = is_affected(ch,(int)gsn_jackal);
    if (bVar2) {
      switchD_00333f01::default(ch,(int)gsn_jackal);
    }
    if (ch->fighting != (CHAR_DATA *)0x0) {
      bVar2 = is_affected(ch,(int)gsn_rage);
      if (bVar2) {
        init_affect(&AStack_88);
        AStack_88.where = 0;
        AStack_88.type = gsn_jackal;
        AStack_88.aftype = 5;
        AStack_88.level = ch->level;
        AStack_88.duration = 2;
        AStack_88.location = 0x13;
        AStack_88.modifier =
             (AStack_88.level / 0x33) *
             (short)(int)((100.0 - ((float)pCVar1->hit / (float)(int)pCVar1->max_hit) * 100.0) * 0.5
                         );
        affect_to_char(ch,&AStack_88);
        AStack_88.location = 0x12;
        affect_to_char(ch,&AStack_88);
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_horde_jackal(OBJ_DATA *obj, bool isTick)
{
	CHAR_DATA *victim, *ch = obj->carried_by;
	AFFECT_DATA af;

	if (!ch)
		return;

	victim = ch->fighting;

	if (is_affected(ch, gsn_jackal))
		affect_strip(ch, gsn_jackal);

	if (!ch->fighting || !is_affected(ch, gsn_rage))
		return;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_jackal;
	af.aftype = AFT_INVIS;
	af.level = ch->level;
	af.duration = 2;
	af.location = APPLY_DAMROLL;
	af.modifier = (short)((100 - (((float)victim->hit / (float)victim->max_hit) * 100)) / 2) * (ch->level / 51);
	affect_to_char(ch, &af);

	af.location = APPLY_HITROLL;
	affect_to_char(ch, &af);
}